

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O0

int __thiscall
delegating_shared_control_block<IntermediateBaseA,_MultiplyDerived>::clone
          (delegating_shared_control_block<IntermediateBaseA,_MultiplyDerived> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  shared_ptr<shared_control_block<MultiplyDerived>_> local_38;
  shared_ptr<delegating_shared_control_block<IntermediateBaseA,_MultiplyDerived>_> local_28;
  __fn *local_18;
  delegating_shared_control_block<IntermediateBaseA,_MultiplyDerived> *this_local;
  
  local_18 = __fn;
  this_local = this;
  peVar1 = std::
           __shared_ptr_access<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(__fn + 8));
  (*peVar1->_vptr_shared_control_block[2])();
  std::
  make_shared<delegating_shared_control_block<IntermediateBaseA,MultiplyDerived>,std::shared_ptr<shared_control_block<MultiplyDerived>>>
            ((shared_ptr<shared_control_block<MultiplyDerived>_> *)&local_28);
  std::shared_ptr<shared_control_block<IntermediateBaseA>>::
  shared_ptr<delegating_shared_control_block<IntermediateBaseA,MultiplyDerived>,void>
            ((shared_ptr<shared_control_block<IntermediateBaseA>> *)this,&local_28);
  std::shared_ptr<delegating_shared_control_block<IntermediateBaseA,_MultiplyDerived>_>::~shared_ptr
            (&local_28);
  std::shared_ptr<shared_control_block<MultiplyDerived>_>::~shared_ptr(&local_38);
  return (int)this;
}

Assistant:

std::shared_ptr<shared_control_block<T>> clone() const override
  {
    return std::make_shared<delegating_shared_control_block>(delegate_->clone());
  }